

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_xml.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::XmlReporter(XmlReporter *this,ReporterConfig *_config)

{
  ReporterConfig *_config_local;
  XmlReporter *this_local;
  
  StreamingReporterBase::StreamingReporterBase(&this->super_StreamingReporterBase,_config);
  (this->super_StreamingReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__XmlReporter_002010e0;
  Timer::Timer(&this->m_testCaseTimer);
  XmlWriter::XmlWriter(&this->m_xml);
  this->m_sectionDepth = 0;
  return;
}

Assistant:

XmlReporter( ReporterConfig const& _config )
        :   StreamingReporterBase( _config ),
            m_sectionDepth( 0 )
        {}